

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.hpp
# Opt level: O3

object * __thiscall
msgpack::v1::adaptor::convert<std::tuple<dummy1>,_void>::operator()
          (convert<std::tuple<dummy1>,_void> *this,object *o,tuple<dummy1> *v)

{
  object *poVar1;
  undefined8 *puVar2;
  define_array<unsigned_long,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_38;
  object local_28;
  
  if ((o->super_object).type == ARRAY) {
    if ((o->super_object).via.array.size != 0) {
      poVar1 = (o->super_object).via.array.ptr;
      local_28.via.array.ptr = (poVar1->super_object).via.array.ptr;
      local_28.type = (poVar1->super_object).type;
      local_28._4_4_ = *(undefined4 *)&(poVar1->super_object).field_0x4;
      local_28.via.u64 = (poVar1->super_object).via.u64;
      local_38.a.
      super__Tuple_impl<0UL,_unsigned_long_&,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>
      .
      super__Tuple_impl<1UL,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>
      .
      super__Head_base<1UL,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&,_false>
      ._M_head_impl =
           (_Head_base<1UL,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&,_false>
            )&(v->super__Tuple_impl<0UL,_dummy1>).super__Head_base<0UL,_dummy1,_false>._M_head_impl.
              str;
      local_38.a.
      super__Tuple_impl<0UL,_unsigned_long_&,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&>
      .super__Head_base<0UL,_unsigned_long_&,_false>._M_head_impl = (unsigned_long *)v;
      type::
      define_array<unsigned_long,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      ::msgpack_unpack(&local_38,(object *)&local_28);
    }
    return o;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__bad_cast_001649f8;
  __cxa_throw(puVar2,&type_error::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

msgpack::object const& operator()(
        msgpack::object const& o,
        std::tuple<Args...>& v) const {
        if(o.type != msgpack::type::ARRAY) { throw msgpack::type_error(); }
        StdTupleConverter<decltype(v), sizeof...(Args)>::convert(o, v);
        return o;
    }